

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_426d84::SizeofParamPackExpr::printLeft(SizeofParamPackExpr *this,OutputStream *S)

{
  StringView local_50;
  undefined1 local_40 [8];
  ParameterPackExpansion PPE;
  OutputStream *S_local;
  SizeofParamPackExpr *this_local;
  
  StringView::StringView((StringView *)&PPE.Child,"sizeof...(");
  OutputStream::operator+=(S,stack0xffffffffffffffd8);
  ParameterPackExpansion::ParameterPackExpansion((ParameterPackExpansion *)local_40,this->Pack);
  ParameterPackExpansion::printLeft((ParameterPackExpansion *)local_40,S);
  StringView::StringView(&local_50,")");
  OutputStream::operator+=(S,local_50);
  ParameterPackExpansion::~ParameterPackExpansion((ParameterPackExpansion *)local_40);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "sizeof...(";
    ParameterPackExpansion PPE(Pack);
    PPE.printLeft(S);
    S += ")";
  }